

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::onDecodeFailure(Connection *this,Result *error)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  string local_1c0;
  LogStringBuffer local_1a0;
  
  if ((error->Error->Type != Tonk) || (error->Error->Code != 0xf)) {
    Result::ToJson_abi_cxx11_(&local_1c0,error);
    if ((int)(this->Logger).ChannelMinLevel < 5) {
      local_1a0.ChannelName = (this->Logger).ChannelName;
      this_00 = &local_1a0.LogStream;
      local_1a0.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,(string *)&(this->Logger).Prefix);
      std::operator<<((ostream *)this_00,"Authenticated datagram decode failure: ");
      std::operator<<((ostream *)this_00,(string *)&local_1c0);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,&local_1a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
    std::__cxx11::string::~string((string *)&local_1c0);
    RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,9,error);
  }
  return;
}

Assistant:

void Connection::onDecodeFailure(const Result& error)
{
    TONK_DEBUG_ASSERT(error.IsFail());

    const bool isUnauthenticatedData = \
        error.Error->Type == ErrorType::Tonk &&
        error.Error->Code == Tonk_BogonData;

    if (isUnauthenticatedData)
    {
        // Disabled this log
        //Logger.Debug("Bogon data ignored: ", error.ToJson());
        return;
    }

    Logger.Error("Authenticated datagram decode failure: ", error.ToJson());
    SelfRefCount.StartShutdown(Tonk_InvalidData, error);
}